

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O2

gnode_t * parse_list_expression(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  gtoken_t gVar1;
  gtoken_t gVar2;
  gnode_r *list1;
  gnode_r *list2;
  gnode_t **ppgVar3;
  gnode_t *pgVar4;
  size_t sVar5;
  size_t sVar6;
  _Bool ismap;
  gtoken_s token;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  parse_required(parser,TOK_OP_OPEN_SQUAREBRACKET);
  gravity_lexer_token(lexer);
  gVar1 = gravity_lexer_peek(lexer);
  if (gVar1 == TOK_OP_CLOSED_SQUAREBRACKET) {
    gravity_lexer_next(lexer);
    sVar5 = parser->declarations->n;
    if (sVar5 == 0) {
      pgVar4 = (gnode_t *)0x0;
    }
    else {
      pgVar4 = parser->declarations->p[sVar5 - 1];
    }
    list1 = (gnode_r *)0x0;
    list2 = (gnode_r *)0x0;
    ismap = false;
  }
  else {
    gVar1 = gravity_lexer_peek(lexer);
    if (gVar1 != TOK_OP_COLON) {
      pgVar4 = parse_expression(parser);
      gVar1 = gravity_lexer_peek(lexer);
      list1 = gnode_array_create();
      if (gVar1 == TOK_OP_COLON) {
        list2 = gnode_array_create();
      }
      else {
        list2 = (gnode_r *)0x0;
      }
      if (pgVar4 != (gnode_t *)0x0) {
        sVar5 = list1->n;
        if (sVar5 == list1->m) {
          sVar6 = sVar5 * 2;
          if (sVar5 == 0) {
            sVar6 = 8;
          }
          list1->m = sVar6;
          ppgVar3 = (gnode_t **)realloc(list1->p,sVar6 << 3);
          list1->p = ppgVar3;
          sVar5 = list1->n;
        }
        else {
          ppgVar3 = list1->p;
        }
        list1->n = sVar5 + 1;
        ppgVar3[sVar5] = pgVar4;
      }
      if (gVar1 != TOK_OP_COLON) goto LAB_0010c3a7;
      parse_required(parser,TOK_OP_COLON);
      pgVar4 = parse_expression(parser);
      if (pgVar4 == (gnode_t *)0x0) goto LAB_0010c3a7;
      sVar5 = list2->n;
      if (sVar5 != list2->m) {
        ppgVar3 = list2->p;
        goto LAB_0010c39b;
      }
      sVar6 = sVar5 * 2;
      if (sVar5 == 0) {
        sVar6 = 8;
      }
      list2->m = sVar6;
      ppgVar3 = list2->p;
      do {
        ppgVar3 = (gnode_t **)realloc(ppgVar3,sVar6 << 3);
        list2->p = ppgVar3;
        sVar5 = list2->n;
LAB_0010c39b:
        do {
          list2->n = sVar5 + 1;
          ppgVar3[sVar5] = pgVar4;
LAB_0010c3a7:
          do {
            do {
              gVar2 = gravity_lexer_peek(lexer);
              if (gVar2 != TOK_OP_COMMA) {
                parse_required(parser,TOK_OP_CLOSED_SQUAREBRACKET);
                sVar5 = parser->declarations->n;
                if (sVar5 == 0) {
                  pgVar4 = (gnode_t *)0x0;
                }
                else {
                  pgVar4 = parser->declarations->p[sVar5 - 1];
                }
                ismap = gVar1 == TOK_OP_COLON;
                goto LAB_0010c4b3;
              }
              gravity_lexer_next(lexer);
              pgVar4 = parse_expression(parser);
              if (pgVar4 != (gnode_t *)0x0) {
                sVar5 = list1->n;
                ppgVar3 = list1->p;
                if (sVar5 == list1->m) {
                  sVar6 = sVar5 * 2;
                  if (sVar5 == 0) {
                    sVar6 = 8;
                  }
                  list1->m = sVar6;
                  ppgVar3 = (gnode_t **)realloc(ppgVar3,sVar6 << 3);
                  list1->p = ppgVar3;
                  sVar5 = list1->n;
                }
                list1->n = sVar5 + 1;
                ppgVar3[sVar5] = pgVar4;
              }
            } while (gVar1 != TOK_OP_COLON);
            parse_required(parser,TOK_OP_COLON);
            pgVar4 = parse_expression(parser);
          } while (pgVar4 == (gnode_t *)0x0);
          sVar5 = list2->n;
          ppgVar3 = list2->p;
        } while (sVar5 != list2->m);
        sVar6 = sVar5 * 2;
        if (sVar5 == 0) {
          sVar6 = 8;
        }
        list2->m = sVar6;
      } while( true );
    }
    gravity_lexer_next(lexer);
    parse_required(parser,TOK_OP_CLOSED_SQUAREBRACKET);
    sVar5 = parser->declarations->n;
    if (sVar5 == 0) {
      pgVar4 = (gnode_t *)0x0;
    }
    else {
      pgVar4 = parser->declarations->p[sVar5 - 1];
    }
    ismap = true;
    list1 = (gnode_r *)0x0;
    list2 = (gnode_r *)0x0;
  }
LAB_0010c4b3:
  token_00._8_8_ = token._8_8_;
  token_00._0_8_ = token._0_8_;
  token_00._16_8_ = token._16_8_;
  token_00._24_8_ = token._24_8_;
  token_00.value = token.value;
  pgVar4 = gnode_list_expr_create(token_00,list1,list2,ismap,pgVar4);
  return pgVar4;
}

Assistant:

static gnode_t *parse_list_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_list_expression");
    DECLARE_LEXER;

    /*
     list_expression
     :    '[' ((expression) (',' expression)*)? ']'        // array or empty array
     |    '[' ((map_entry (',' map_entry)*) | ':') ']'    // map or empty map
     ;

     map_entry
     :    STRING ':' expression
     ;
     */

    // consume first '['
    parse_required(parser, TOK_OP_OPEN_SQUAREBRACKET);

    // this saved token is necessary to save start of the list/map
    gtoken_s token = gravity_lexer_token(lexer);

    // check for special empty list
    if (gravity_lexer_peek(lexer) == TOK_OP_CLOSED_SQUAREBRACKET) {
        gravity_lexer_next(lexer); // consume TOK_OP_CLOSED_SQUAREBRACKET
        return gnode_list_expr_create(token, NULL, NULL, false, LAST_DECLARATION());
    }

    // check for special empty map
    if (gravity_lexer_peek(lexer) == TOK_OP_COLON) {
        gravity_lexer_next(lexer); // consume TOK_OP_COLON
        parse_required(parser, TOK_OP_CLOSED_SQUAREBRACKET);
        return gnode_list_expr_create(token, NULL, NULL, true, LAST_DECLARATION());
    }

    // parse first expression (if any) outside of the list/map loop
    // in order to check if it is a list or map expression
    gnode_t *expr1 = parse_expression(parser);

    // if next token is a colon then assume a map
    bool ismap = (gravity_lexer_peek(lexer) == TOK_OP_COLON);

    // a list expression can be an array [expr1, expr2] or a map [string1: expr1, string2: expr2]
    // cannot be mixed so be very restrictive here

    gnode_r *list1 = gnode_array_create();
    gnode_r *list2 = (ismap) ? gnode_array_create() : NULL;
    if (expr1) gnode_array_push(list1, expr1);

    if (ismap) {
        parse_required(parser, TOK_OP_COLON);
        gnode_t *expr2 = parse_expression(parser);
        if (expr2) gnode_array_push(list2, expr2);
    }

    while (gravity_lexer_peek(lexer) == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA

        // parse first expression
        expr1 = parse_expression(parser);
        if (expr1) gnode_array_push(list1, expr1);

        if (ismap) {
            parse_required(parser, TOK_OP_COLON);
            gnode_t *expr2 = parse_expression(parser);
            if (expr2) gnode_array_push(list2, expr2);
        }
    }

    parse_required(parser, TOK_OP_CLOSED_SQUAREBRACKET);
    return gnode_list_expr_create(token, list1, list2, ismap, LAST_DECLARATION());
}